

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

Buffer * __thiscall Liby::UdpSocket::getReadBuf(UdpSocket *this,Endpoint *ep)

{
  iterator iVar1;
  undefined4 *puVar2;
  
  iVar1 = std::
          _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
          ::find(&(this->conns_)._M_t,ep);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->conns_)._M_t._M_impl.super__Rb_tree_header) {
    return (Buffer *)&iVar1._M_node[1]._M_parent[1]._M_parent;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

Buffer &UdpSocket::getReadBuf(const Liby::Endpoint &ep) {
    auto it = conns_.find(ep);
    if (it == conns_.end()) {
        throw 0;
    } else {
        return it->second->getReadBuf();
    }
}